

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O0

int net_udp4_recv_socket(char *hostname,unsigned_short port)

{
  int iVar1;
  uint32_t uVar2;
  int local_38;
  uint32_t local_34;
  ip_mreq mreq;
  int fd;
  sockaddr_in addr;
  unsigned_short port_local;
  char *hostname_local;
  
  addr.sin_zero._2_2_ = port;
  unique0x1000017a = hostname;
  iVar1 = net_ip4_resolve_hostname(hostname,port,(uchar *)0x0,(sockaddr_in *)&mreq.imr_interface);
  if (iVar1 == 0) {
    memset(&fd,0,4);
  }
  mreq.imr_multiaddr.s_addr =
       net_udp4_socket((sockaddr_in *)&mreq.imr_interface,addr.sin_zero._2_2_,'\x01');
  if ((int)mreq.imr_multiaddr.s_addr < 0) {
    return -1;
  }
  iVar1 = bind(mreq.imr_multiaddr.s_addr,(sockaddr *)&mreq.imr_interface,0x10);
  if (iVar1 < 0) {
    perror("bind");
LAB_001028b5:
    iVar1 = close(mreq.imr_multiaddr.s_addr);
    if (iVar1 < 0) {
      perror("close");
    }
    hostname_local._4_4_ = 0xffffffff;
  }
  else {
    uVar2 = htonl(fd);
    if ((uVar2 & 0xf0000000) == 0xe0000000) {
      local_38 = fd;
      local_34 = htonl(0);
      iVar1 = setsockopt(mreq.imr_multiaddr.s_addr,0,0x23,&local_38,8);
      if (iVar1 < 0) {
        perror("setsockopt");
        goto LAB_001028b5;
      }
    }
    hostname_local._4_4_ = mreq.imr_multiaddr.s_addr;
  }
  return hostname_local._4_4_;
}

Assistant:

int net_udp4_recv_socket(char *hostname,
                         unsigned short port) {
  struct sockaddr_in addr;
  if (!net_ip4_resolve_hostname(hostname, port, NULL, &addr))
    memset(&addr.sin_addr, 0, sizeof(addr.sin_addr));

  /*M
    Create udp socket.
  **/
  int fd;
  if ((fd = net_udp4_socket(&addr, port, 1)) < 0)
    return -1;

  /*M
    Bind to hostname.
  **/
  if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
    perror("bind");
    goto error;
  }

  /*M
    Add multicast membership if address is a multicast address.
  **/
  if (IN_MULTICAST(htonl(addr.sin_addr.s_addr))) {
    struct ip_mreq mreq;
    mreq.imr_multiaddr.s_addr = addr.sin_addr.s_addr;
    mreq.imr_interface.s_addr = htonl(INADDR_ANY);

    if (setsockopt(fd,
                   IPPROTO_IP,
                   IP_ADD_MEMBERSHIP,
                   &mreq, sizeof(mreq)) < 0) {
      perror("setsockopt");
      goto error;
    }
  }

  return fd;

 error:
  if (close(fd) < 0)
    perror("close");
  return -1;
}